

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocmap.h
# Opt level: O0

uint32_t __thiscall allocmap::findfree(allocmap *this,uint32_t size)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  _Self local_30;
  iterator i;
  uint32_t local_20;
  uint32_t ofs;
  uint32_t size_local;
  allocmap *this_local;
  
  i = std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::begin(&this->_m);
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->(&i);
  local_20 = ppVar2->first;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::begin(&this->_m);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->_m);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) {
      markused(this,local_20,size,"findfree");
      return local_20;
    }
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                       (&local_30);
    if (size <= ppVar2->first - local_20) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                       (&local_30);
    local_20 = ppVar2->first;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                       (&local_30);
    local_20 = local_20 + ppVar2->second;
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++(&local_30);
  }
  markused(this,local_20,size,"findfree");
  return local_20;
}

Assistant:

uint32_t findfree(uint32_t size)
    {
        uint32_t ofs= _m.begin()->first;
        for (auto i=_m.begin() ; i!=_m.end() ; ++i)
        {
            if (i->first-ofs >= size) {
                markused(ofs, size, "findfree");
                return ofs;
            }

            ofs= i->first + i->second;
        }
        // allocate new item at end
        markused(ofs, size, "findfree");
        return ofs;
    }